

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_transaction.cpp
# Opt level: O2

TransactionType duckdb::TransformTransactionType(PGTransactionStmtKind kind)

{
  NotImplementedException *this;
  allocator local_41;
  string local_40;
  
  if (kind < PG_TRANS_STMT_SAVEPOINT) {
    return (TransactionType)(0x3020101 >> ((byte)(kind << 3) & 0x1f));
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Transaction type %d not implemented yet",&local_41);
  NotImplementedException::NotImplementedException<duckdb_libpgquery::PGTransactionStmtKind>
            (this,&local_40,kind);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TransactionType TransformTransactionType(duckdb_libpgquery::PGTransactionStmtKind kind) {
	switch (kind) {
	case duckdb_libpgquery::PG_TRANS_STMT_BEGIN:
	case duckdb_libpgquery::PG_TRANS_STMT_START:
		return TransactionType::BEGIN_TRANSACTION;
	case duckdb_libpgquery::PG_TRANS_STMT_COMMIT:
		return TransactionType::COMMIT;
	case duckdb_libpgquery::PG_TRANS_STMT_ROLLBACK:
		return TransactionType::ROLLBACK;
	default:
		throw NotImplementedException("Transaction type %d not implemented yet", kind);
	}
}